

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Multiple::_Run(_Test_Multiple *this)

{
  WriteBatch *b;
  int local_1f4;
  string local_1f0;
  WriteBatch batch;
  char *local_1b0;
  char *local_1a8;
  
  WriteBatch::WriteBatch(&batch);
  local_1b0 = "foo";
  local_1a8 = (char *)0x3;
  local_1f0._M_dataplus._M_p = "bar";
  local_1f0._M_string_length = 3;
  WriteBatch::Put(&batch,(Slice *)&local_1b0,(Slice *)&local_1f0);
  local_1b0 = "box";
  local_1a8 = (char *)0x3;
  WriteBatch::Delete(&batch,(Slice *)&local_1b0);
  local_1b0 = "baz";
  local_1a8 = (char *)0x3;
  local_1f0._M_dataplus._M_p = "boo";
  local_1f0._M_string_length = 3;
  WriteBatch::Put(&batch,(Slice *)&local_1b0,(Slice *)&local_1f0);
  WriteBatchInternal::SetSequence(&batch,100);
  test::Tester::Tester
            ((Tester *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x45);
  local_1f4 = 100;
  local_1f0._M_dataplus._M_p = (pointer)WriteBatchInternal::Sequence(&batch);
  test::Tester::IsEq<int,unsigned_long>((Tester *)&local_1b0,&local_1f4,(unsigned_long *)&local_1f0)
  ;
  test::Tester::~Tester((Tester *)&local_1b0);
  test::Tester::Tester
            ((Tester *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x46);
  local_1f0._M_dataplus._M_p._0_4_ = 3;
  local_1f4 = WriteBatchInternal::Count(&batch);
  test::Tester::IsEq<int,int>((Tester *)&local_1b0,(int *)&local_1f0,&local_1f4);
  test::Tester::~Tester((Tester *)&local_1b0);
  test::Tester::Tester
            ((Tester *)&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x4b);
  PrintContents_abi_cxx11_(&local_1f0,(leveldb *)&batch,b);
  test::Tester::IsEq<char[50],std::__cxx11::string>
            ((Tester *)&local_1b0,(char (*) [50])"Put(baz, boo)@102Delete(box)@101Put(foo, bar)@100"
             ,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  test::Tester::~Tester((Tester *)&local_1b0);
  WriteBatch::~WriteBatch(&batch);
  return;
}

Assistant:

TEST(WriteBatchTest, Multiple) {
  WriteBatch batch;
  batch.Put(Slice("foo"), Slice("bar"));
  batch.Delete(Slice("box"));
  batch.Put(Slice("baz"), Slice("boo"));
  WriteBatchInternal::SetSequence(&batch, 100);
  ASSERT_EQ(100, WriteBatchInternal::Sequence(&batch));
  ASSERT_EQ(3, WriteBatchInternal::Count(&batch));
  ASSERT_EQ(
      "Put(baz, boo)@102"
      "Delete(box)@101"
      "Put(foo, bar)@100",
      PrintContents(&batch));
}